

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppUTestNamerTests.cpp
# Opt level: O2

void __thiscall
TEST_NamerTestGroup_UseSubDirectory_Test::testBody(TEST_NamerTestGroup_UseSubDirectory_Test *this)

{
  shared_ptr<ApprovalTests::ApprovalNamer> namer;
  SubdirectoryDisposer subdirectory;
  allocator<char> local_9a;
  allocator<char> local_99;
  long *local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  string local_88;
  string local_68;
  string local_48 [32];
  SubdirectoryDisposer local_28;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"approved_files",(allocator<char> *)&local_68);
  ApprovalTests::TApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>_>
  ::useApprovalsSubdirectory(&local_28,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  ApprovalTests::TApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>_>
  ::getDefaultNamer();
  std::__cxx11::string::string<std::allocator<char>>(local_48,".txt",&local_99);
  (**(code **)(*local_98 + 0x10))(&local_88,local_98,local_48);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"approved_files",&local_9a)
  ;
  anon_unknown.dwarf_1344f::checkContains(&local_88,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string(local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90);
  ApprovalTests::SubdirectoryDisposer::~SubdirectoryDisposer(&local_28);
  return;
}

Assistant:

TEST(NamerTestGroup, UseSubDirectory)
{
    auto subdirectory = Approvals::useApprovalsSubdirectory("approved_files");
    auto namer = Approvals::getDefaultNamer();
    checkContains(namer->getApprovedFile(".txt"), "approved_files");
}